

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_stream_close(nghttp2_session *session,int32_t stream_id,uint32_t error_code,void *userp)

{
  RTSP *pRVar1;
  stream_ctx *stream;
  int iVar2;
  Curl_easy *data;
  char *pcVar3;
  Curl_easy *data_00;
  
  if (userp == (void *)0x0) {
    data_00 = (Curl_easy *)0x0;
  }
  else {
    data_00 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
  }
  if ((stream_id == 0) ||
     (data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id),
     data == (Curl_easy *)0x0)) {
    if (data_00 == (Curl_easy *)0x0) {
      return 0;
    }
    if (userp == (void *)0x0) {
      return 0;
    }
    if ((*(ulong *)&(data_00->set).field_0x8ba & 0x10000000) == 0) {
      return 0;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return 0;
    }
    pcVar3 = "[%d] on_stream_close, no easy set on stream";
    iVar2 = 0;
  }
  else {
    if (data->magic != 0xc0dedbad) {
      if ((((data_00 != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
          ((*(ulong *)&(data_00->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(data_00,(Curl_cfilter *)userp,
                          "[%d] on_stream_close, not a GOOD easy on stream",stream_id);
      }
      nghttp2_session_set_stream_user_data(session,stream_id,(void *)0x0);
      return -0x386;
    }
    pRVar1 = (data->req).p.rtsp;
    if ((pRVar1 != (RTSP *)0x0) &&
       (stream = (stream_ctx *)(pRVar1->http_wrapper).h2_ctx, stream != (stream_ctx *)0x0)) {
      stream->closed = true;
      stream->error = error_code;
      if (error_code == 0) {
        if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
           (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] CLOSED",stream_id);
        }
      }
      else {
        stream->reset = true;
        stream->send_closed = true;
        if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
           (0 < *(int *)(*userp + 0xc))) {
          pcVar3 = nghttp2_http2_strerror(error_code);
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] RESET: %s (err %d)",stream_id,pcVar3,
                            (ulong)error_code);
        }
      }
      drain_stream((Curl_cfilter *)userp,data,stream);
      iVar2 = nghttp2_session_set_stream_user_data(session,stream_id,(void *)0x0);
      if (iVar2 == 0) {
        return 0;
      }
      if (((data->set).field_0x8bd & 0x10) == 0) {
        return 0;
      }
      Curl_infof(data,"http/2: failed to clear user_data for stream %u",stream_id);
      return 0;
    }
    iVar2 = -0x386;
    if (userp == (void *)0x0) {
      return -0x386;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return -0x386;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return -0x386;
    }
    pcVar3 = "[%d] on_stream_close, GOOD easy but no stream";
    data_00 = data;
  }
  Curl_trc_cf_infof(data_00,(Curl_cfilter *)userp,pcVar3,stream_id);
  return iVar2;
}

Assistant:

static int on_stream_close(nghttp2_session *session, int32_t stream_id,
                           uint32_t error_code, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct Curl_easy *data_s, *call_data = CF_DATA_CURRENT(cf);
  struct stream_ctx *stream;
  int rv;
  (void)session;

  DEBUGASSERT(call_data);
  /* get the stream from the hash based on Stream ID, stream ID zero is for
     connection-oriented stuff */
  data_s = stream_id?
             nghttp2_session_get_stream_user_data(session, stream_id) : NULL;
  if(!data_s) {
    CURL_TRC_CF(call_data, cf,
                "[%d] on_stream_close, no easy set on stream", stream_id);
    return 0;
  }
  if(!GOOD_EASY_HANDLE(data_s)) {
    /* nghttp2 still has an easy registered for the stream which has
     * been freed be libcurl. This points to a code path that does not
     * trigger DONE or DETACH events as it must. */
    CURL_TRC_CF(call_data, cf,
                "[%d] on_stream_close, not a GOOD easy on stream", stream_id);
    (void)nghttp2_session_set_stream_user_data(session, stream_id, 0);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  stream = H2_STREAM_CTX(data_s);
  if(!stream) {
    CURL_TRC_CF(data_s, cf,
                "[%d] on_stream_close, GOOD easy but no stream", stream_id);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  stream->closed = TRUE;
  stream->error = error_code;
  if(stream->error) {
    stream->reset = TRUE;
    stream->send_closed = TRUE;
  }

  if(stream->error)
    CURL_TRC_CF(data_s, cf, "[%d] RESET: %s (err %d)",
              stream_id, nghttp2_http2_strerror(error_code), error_code);
  else
    CURL_TRC_CF(data_s, cf, "[%d] CLOSED", stream_id);
  drain_stream(cf, data_s, stream);

  /* remove `data_s` from the nghttp2 stream */
  rv = nghttp2_session_set_stream_user_data(session, stream_id, 0);
  if(rv) {
    infof(data_s, "http/2: failed to clear user_data for stream %u",
          stream_id);
    DEBUGASSERT(0);
  }
  return 0;
}